

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_decompress_unsafe_generic
              (BYTE *istart,BYTE *ostart,int decompressedSize,size_t prefixSize,BYTE *dictStart,
              size_t dictSize)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  byte *__src;
  ushort *puVar4;
  BYTE *pBVar5;
  ulong uVar6;
  BYTE *__src_00;
  BYTE *pBVar7;
  BYTE *__dest;
  uint uVar8;
  size_t l;
  long lVar9;
  ulong uVar10;
  ushort *puVar11;
  size_t l_1;
  BYTE *__n;
  int local_48;
  
  pBVar7 = ostart + decompressedSize;
  lVar3 = (long)ostart - prefixSize;
  puVar11 = (ushort *)istart;
  while( true ) {
    uVar2 = *puVar11;
    __src = (byte *)((long)puVar11 + 1);
    uVar8 = (uint)(byte)((byte)uVar2 >> 4);
    uVar10 = (ulong)uVar8;
    if (uVar8 == 0xf) {
      lVar9 = 0;
      do {
        bVar1 = *__src;
        __src = __src + 1;
        lVar9 = lVar9 + (ulong)bVar1;
      } while ((ulong)bVar1 == 0xff);
      uVar10 = lVar9 + 0xf;
    }
    if ((ulong)((long)pBVar7 - (long)ostart) < uVar10) {
      return -1;
    }
    memmove(ostart,__src,uVar10);
    __dest = ostart + uVar10;
    puVar4 = (ushort *)(__src + uVar10);
    if (pBVar7 + -(long)__dest < (BYTE *)0xc) {
      if (__dest != pBVar7) {
        return -1;
      }
      local_48 = (int)istart;
      return (int)puVar4 - local_48;
    }
    uVar10 = (ulong)((byte)uVar2 & 0xf);
    puVar11 = puVar4 + 1;
    if (uVar10 == 0xf) {
      lVar9 = 0;
      do {
        uVar2 = *puVar11;
        puVar11 = (ushort *)((long)puVar11 + 1);
        lVar9 = lVar9 + (ulong)(byte)uVar2;
      } while ((ulong)(byte)uVar2 == 0xff);
      uVar10 = lVar9 + 0xf;
    }
    __n = (BYTE *)(uVar10 + 4);
    if (pBVar7 + -(long)__dest < __n) break;
    uVar10 = (ulong)*puVar4;
    uVar6 = (long)__dest - lVar3;
    if (uVar6 + dictSize < uVar10) {
      return -1;
    }
    if (uVar6 < uVar10) {
      __src_00 = dictStart + (uVar6 - uVar10) + dictSize;
      pBVar5 = dictStart + (dictSize - (long)__src_00);
      if (__n < pBVar5) {
        memmove(__dest,__src_00,(size_t)__n);
        pBVar5 = __n;
        __n = (BYTE *)0x0;
      }
      else {
        memmove(__dest,__src_00,(size_t)pBVar5);
        __n = __n + -(long)pBVar5;
      }
      __dest = __dest + (long)pBVar5;
      lVar9 = lVar3;
    }
    else {
      lVar9 = (long)__dest - uVar10;
    }
    if (__n != (BYTE *)0x0) {
      pBVar5 = (BYTE *)0x0;
      do {
        __dest[(long)pBVar5] = pBVar5[lVar9];
        pBVar5 = pBVar5 + 1;
      } while (__n != pBVar5);
    }
    ostart = __dest + (long)__n;
    if ((ulong)((long)pBVar7 - (long)ostart) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_INLINE int
LZ4_decompress_unsafe_generic(
                 const BYTE* const istart,
                 BYTE* const ostart,
                 int decompressedSize,

                 size_t prefixSize,
                 const BYTE* const dictStart,  /* only if dict==usingExtDict */
                 const size_t dictSize         /* note: =0 if dictStart==NULL */
                 )
{
    const BYTE* ip = istart;
    BYTE* op = (BYTE*)ostart;
    BYTE* const oend = ostart + decompressedSize;
    const BYTE* const prefixStart = ostart - prefixSize;

    DEBUGLOG(5, "LZ4_decompress_unsafe_generic");
    if (dictStart == NULL) assert(dictSize == 0);

    while (1) {
        /* start new sequence */
        unsigned token = *ip++;

        /* literals */
        {   size_t ll = token >> ML_BITS;
            if (ll==15) {
                /* long literal length */
                ll += read_long_length_no_check(&ip);
            }
            if ((size_t)(oend-op) < ll) return -1; /* output buffer overflow */
            LZ4_memmove(op, ip, ll); /* support in-place decompression */
            op += ll;
            ip += ll;
            if ((size_t)(oend-op) < MFLIMIT) {
                if (op==oend) break;  /* end of block */
                DEBUGLOG(5, "invalid: literals end at distance %zi from end of block", oend-op);
                /* incorrect end of block :
                 * last match must start at least MFLIMIT==12 bytes before end of output block */
                return -1;
        }   }

        /* match */
        {   size_t ml = token & 15;
            size_t const offset = LZ4_readLE16(ip);
            ip+=2;

            if (ml==15) {
                /* long literal length */
                ml += read_long_length_no_check(&ip);
            }
            ml += MINMATCH;

            if ((size_t)(oend-op) < ml) return -1; /* output buffer overflow */

            {   const BYTE* match = op - offset;

                /* out of range */
                if (offset > (size_t)(op - prefixStart) + dictSize) {
                    DEBUGLOG(6, "offset out of range");
                    return -1;
                }

                /* check special case : extDict */
                if (offset > (size_t)(op - prefixStart)) {
                    /* extDict scenario */
                    const BYTE* const dictEnd = dictStart + dictSize;
                    const BYTE* extMatch = dictEnd - (offset - (size_t)(op-prefixStart));
                    size_t const extml = (size_t)(dictEnd - extMatch);
                    if (extml > ml) {
                        /* match entirely within extDict */
                        LZ4_memmove(op, extMatch, ml);
                        op += ml;
                        ml = 0;
                    } else {
                        /* match split between extDict & prefix */
                        LZ4_memmove(op, extMatch, extml);
                        op += extml;
                        ml -= extml;
                    }
                    match = prefixStart;
                }

                /* match copy - slow variant, supporting overlap copy */
                {   size_t u;
                    for (u=0; u<ml; u++) {
                        op[u] = match[u];
            }   }   }
            op += ml;
            if ((size_t)(oend-op) < LASTLITERALS) {
                DEBUGLOG(5, "invalid: match ends at distance %zi from end of block", oend-op);
                /* incorrect end of block :
                 * last match must stop at least LASTLITERALS==5 bytes before end of output block */
                return -1;
            }
        } /* match */
    } /* main loop */
    return (int)(ip - istart);
}